

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O2

Edge * __thiscall
S2VertexIdLaxLoopShape::chain_edge
          (Edge *__return_storage_ptr__,S2VertexIdLaxLoopShape *this,int i,int j)

{
  int iVar1;
  int *piVar2;
  S2Point *pSVar3;
  VType VVar4;
  int iVar5;
  S2LogMessage SStack_18;
  
  if (i == 0) {
    iVar1 = *(int *)&(this->super_S2Shape).field_0xc;
    if (j < iVar1) {
      iVar5 = 0;
      if (j + 1 != iVar1) {
        iVar5 = j + 1;
      }
      piVar2 = (this->vertex_ids_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
               .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      pSVar3 = this->vertex_array_;
      iVar1 = piVar2[j];
      iVar5 = piVar2[iVar5];
      (__return_storage_ptr__->v0).c_[2] = pSVar3[iVar1].c_[2];
      VVar4 = pSVar3[iVar1].c_[1];
      (__return_storage_ptr__->v0).c_[0] = pSVar3[iVar1].c_[0];
      (__return_storage_ptr__->v0).c_[1] = VVar4;
      VVar4 = pSVar3[iVar5].c_[1];
      (__return_storage_ptr__->v1).c_[0] = pSVar3[iVar5].c_[0];
      (__return_storage_ptr__->v1).c_[1] = VVar4;
      (__return_storage_ptr__->v1).c_[2] = pSVar3[iVar5].c_[2];
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
               ,0x5f,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (j) < (num_edges()) ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
               ,0x5e,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (i) == (0) ");
  }
  abort();
}

Assistant:

S2Shape::Edge S2VertexIdLaxLoopShape::chain_edge(int i, int j) const {
  S2_DCHECK_EQ(i, 0);
  S2_DCHECK_LT(j, num_edges());
  int k = (j + 1 == num_vertices()) ? 0 : j + 1;
  return Edge(vertex(j), vertex(k));
}